

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::getParam(Master *this,string *caller_id,string *key,Connection *param_4)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  XmlRpcValue *pXVar2;
  string *value_00;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value aVar3;
  undefined8 in_RDI;
  RpcValue RVar4;
  RpcValue value;
  RpcValue *res;
  undefined8 in_stack_fffffffffffffdf8;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe18;
  XmlRpcValue *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [32];
  string local_128 [52];
  undefined4 local_f4;
  undefined4 local_f0;
  undefined1 local_e9 [40];
  undefined1 local_c1 [33];
  string local_a0 [32];
  string local_80 [8];
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  ParameterStorage *in_stack_ffffffffffffff98;
  XmlRpcValue local_40;
  byte local_29;
  
  i = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_29 = 0;
  XmlRpc::XmlRpcValue::Array((int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  ParameterStorage::getParam
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = XmlRpc::XmlRpcValue::valid(&local_40);
  if (bVar1) {
    local_f4 = 1;
    value_00 = (string *)XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe00,i)
    ;
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
               (allocator<char> *)in_stack_fffffffffffffe30);
    ::std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
               (allocator<char> *)in_stack_fffffffffffffe30);
    ::std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffe20,value_00);
    pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe00,i);
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)in_stack_fffffffffffffe40,(XmlRpcValue *)in_stack_fffffffffffffe38);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52c590);
    ::std::__cxx11::string::~string(local_128);
    ::std::__cxx11::string::~string(local_190);
    ::std::allocator<char>::~allocator(&local_191);
    ::std::__cxx11::string::~string(local_148);
    ::std::__cxx11::string::~string(local_168);
    ::std::allocator<char>::~allocator(&local_169);
    XmlRpc::XmlRpcValue::operator[](pXVar2,i);
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)in_stack_fffffffffffffe40,(XmlRpcValue *)in_stack_fffffffffffffe38);
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe00,i);
    XmlRpc::XmlRpcValue::operator=
              ((XmlRpcValue *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffe30);
    ::std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__lhs,(allocator<char> *)__rhs);
    ::std::operator+(__lhs,__rhs);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe00,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)__lhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52c2df);
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::~string((string *)(local_e9 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_e9);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string((string *)(local_c1 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_c1);
    local_f0 = 0;
    XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe00,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)__rhs,(int *)pXVar2);
  }
  local_29 = 1;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52c6f9);
  aVar3 = extraout_RDX;
  if ((local_29 & 1) == 0) {
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x52c71e);
    aVar3 = extraout_RDX_00;
  }
  RVar4._value.asDouble = aVar3.asDouble;
  RVar4._0_8_ = in_RDI;
  return RVar4;
}

Assistant:

Master::RpcValue Master::getParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  RpcValue value = m_parameterStorage.getParam(caller_id, key);
  if (!value.valid()) {
    res[0] = -1;
    res[1] = std::string("Parameter [") + key + std::string("] is not set");
    res[2] = 0;
  } else {
    res[0] = 1;
    res[1] = std::string("Parameter [") + key + std::string("]");
    res[2] = value;
  }
  return res;
}